

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O0

ssize_t tnt_object_add_array(tnt_stream *s,uint32_t size)

{
  void *pvVar1;
  int iVar2;
  ssize_t rv;
  tnt_stream_buf *sb;
  char *end;
  tnt_sbuf_object *ptStack_28;
  char data [6];
  tnt_sbuf_object *sbo;
  uint32_t size_local;
  tnt_stream *s_local;
  
  ptStack_28 = *(tnt_sbuf_object **)((long)s->data + 0x30);
  if (ptStack_28->stack_size != '\0') {
    iVar2 = ptStack_28->stack_size - 1;
    ptStack_28->stack[iVar2].size = ptStack_28->stack[iVar2].size + 1;
  }
  pvVar1 = s->data;
  if ((ptStack_28->stack_size == ptStack_28->stack_alloc) &&
     (iVar2 = tnt_sbuf_object_grow_stack(ptStack_28), iVar2 == -1)) {
    s_local = (tnt_stream *)0xffffffffffffffff;
  }
  else {
    ptStack_28->stack[ptStack_28->stack_size].size = 0;
    ptStack_28->stack[ptStack_28->stack_size].offset = *(size_t *)((long)pvVar1 + 8);
    ptStack_28->stack[ptStack_28->stack_size].type = '\x05';
    ptStack_28->stack_size = ptStack_28->stack_size + '\x01';
    if (*(int *)(*(long *)((long)s->data + 0x30) + 0xc) == 0) {
      sb = (tnt_stream_buf *)mp_encode_array((char *)((long)&end + 2),size);
    }
    else if (*(int *)(*(long *)((long)s->data + 0x30) + 0xc) == 1) {
      sb = (tnt_stream_buf *)mp_encode_array32((char *)((long)&end + 2),0);
    }
    else {
      if (*(int *)(*(long *)((long)s->data + 0x30) + 0xc) != 2) {
        return -1;
      }
      sb = (tnt_stream_buf *)mp_encode_array((char *)((long)&end + 2),0);
    }
    s_local = (tnt_stream *)(*s->write)(s,(char *)((long)&end + 2),(long)sb - ((long)&end + 2));
  }
  return (ssize_t)s_local;
}

Assistant:

ssize_t
tnt_object_add_array (struct tnt_stream *s, uint32_t size)
{
	struct tnt_sbuf_object *sbo = TNT_SOBJ_CAST(s);
	if (sbo->stack_size > 0)
		sbo->stack[sbo->stack_size - 1].size += 1;
	char data[6], *end;
	struct tnt_stream_buf  *sb  = TNT_SBUF_CAST(s);
	if (sbo->stack_size == sbo->stack_alloc)
		if (tnt_sbuf_object_grow_stack(sbo) == -1)
			return -1;
	sbo->stack[sbo->stack_size].size = 0;
	sbo->stack[sbo->stack_size].offset = sb->size;
	sbo->stack[sbo->stack_size].type = MP_ARRAY;
	sbo->stack_size += 1;
	if (TNT_SOBJ_CAST(s)->type == TNT_SBO_SIMPLE) {
		end = mp_encode_array(data, size);
	} else if (TNT_SOBJ_CAST(s)->type == TNT_SBO_SPARSE) {
		end = mp_encode_array32(data, 0);
	} else if (TNT_SOBJ_CAST(s)->type == TNT_SBO_PACKED) {
		end = mp_encode_array(data, 0);
	} else {
		return -1;
	}
	ssize_t rv = s->write(s, data, end - data);
	return rv;
}